

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O1

void demo_textprintf_ex(ALLEGRO_FONT *font,int x,int y,ALLEGRO_COLOR col,int align,char *format,...)

{
  char in_AL;
  undefined8 in_R9;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM3_Da;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char buf [512];
  float local_318;
  float local_308;
  undefined8 local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  undefined1 local_2d8 [40];
  undefined8 local_2b0;
  undefined4 local_288;
  undefined4 local_278;
  undefined8 local_268;
  undefined8 local_258;
  undefined8 local_248;
  undefined8 local_238;
  char local_228 [520];
  
  local_2e8 = local_2d8;
  if (in_AL != '\0') {
    local_288 = in_XMM2_Da;
    local_278 = in_XMM3_Da;
    local_268 = in_XMM4_Qa;
    local_258 = in_XMM5_Qa;
    local_248 = in_XMM6_Qa;
    local_238 = in_XMM7_Qa;
  }
  local_2f0 = &stack0x00000008;
  local_2f8 = 0x5000000028;
  local_2b0 = in_R9;
  vsnprintf(local_228,0x200,format,&local_2f8);
  if ((uint)align < 3) {
    local_318 = col.r;
    local_308 = col.b;
    al_draw_textf(local_318,local_308,(float)x,(float)y,font,
                  *(undefined4 *)(&DAT_0011258c + (ulong)(uint)align * 4),"%s",local_228);
  }
  return;
}

Assistant:

void demo_textprintf_ex(const ALLEGRO_FONT *font, int x, int y,
                     ALLEGRO_COLOR col, int align, const char *format, ...)
{
   char buf[512];

   va_list ap;

   va_start(ap, format);
   vsnprintf(buf, sizeof(buf), format, ap);
   va_end(ap);

   switch (align) {
      case 0:
         al_draw_textf(font, col, x, y, ALLEGRO_ALIGN_LEFT, "%s", buf);
         break;
      case 1:
         al_draw_textf(font, col, x, y, ALLEGRO_ALIGN_RIGHT, "%s", buf);
         break;
      case 2:
         al_draw_textf(font, col, x, y, ALLEGRO_ALIGN_CENTRE, "%s", buf);
         break;
   };

}